

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O1

lzma_bool lzma_index_iter_locate(lzma_index_iter *iter,lzma_vli target)

{
  long lVar1;
  lzma_bool lVar2;
  long *plVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  void *pvVar7;
  ulong uVar8;
  
  lVar2 = '\x01';
  if (target < ((index_tree *)iter->internal[0].p)[1].root) {
    plVar3 = (long *)index_tree_locate((index_tree *)iter->internal[0].p,target);
    if (plVar3 == (long *)0x0) {
      __assert_fail("stream != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/common/index.c"
                    ,0x4de,"lzma_bool lzma_index_iter_locate(lzma_index_iter *, lzma_vli)");
    }
    lVar1 = *plVar3;
    pvVar4 = index_tree_locate((index_tree *)(plVar3 + 7),target - lVar1);
    if (pvVar4 == (void *)0x0) {
      __assert_fail("group != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/common/index.c"
                    ,0x4e3,"lzma_bool lzma_index_iter_locate(lzma_index_iter *, lzma_vli)");
    }
    if (*(void **)((long)pvVar4 + 0x38) == (void *)0x0) {
      pvVar5 = (void *)0x0;
    }
    else {
      pvVar5 = (void *)0x0;
      pvVar6 = *(void **)((long)pvVar4 + 0x38);
      do {
        uVar8 = (ulong)((long)pvVar6 - (long)pvVar5) >> 1;
        pvVar7 = (void *)(uVar8 + (long)pvVar5);
        if (*(ulong *)((long)pvVar4 + (long)pvVar7 * 0x10 + 0x40) <= target - lVar1) {
          pvVar5 = (void *)((long)pvVar5 + uVar8 + 1);
          pvVar7 = pvVar6;
        }
        pvVar6 = pvVar7;
      } while (pvVar5 < pvVar7);
    }
    iter->internal[1].p = plVar3;
    iter->internal[2].p = pvVar4;
    iter->internal[3].p = pvVar5;
    iter_set_info(iter);
    lVar2 = '\0';
  }
  return lVar2;
}

Assistant:

extern LZMA_API(lzma_bool)
lzma_index_iter_locate(lzma_index_iter *iter, lzma_vli target)
{
	const index_stream *stream;
	const index_group *group;
	size_t left, right;

	const lzma_index *i = iter->internal[ITER_INDEX].p;

	// If the target is past the end of the file, return immediately.
	if (i->uncompressed_size <= target)
		return true;

	// Locate the Stream containing the target offset.
	stream = index_tree_locate(&i->streams, target);
	assert(stream != NULL);
	target -= stream->node.uncompressed_base;

	// Locate the group containing the target offset.
	group = index_tree_locate(&stream->groups, target);
	assert(group != NULL);

	// Use binary search to locate the exact Record. It is the first
	// Record whose uncompressed_sum is greater than target.
	// This is because we want the rightmost Record that fullfills the
	// search criterion. It is possible that there are empty Blocks;
	// we don't want to return them.
	left = 0;
	right = group->last;

	while (left < right) {
		const size_t pos = left + (right - left) / 2;
		if (group->records[pos].uncompressed_sum <= target)
			left = pos + 1;
		else
			right = pos;
	}

	iter->internal[ITER_STREAM].p = stream;
	iter->internal[ITER_GROUP].p = group;
	iter->internal[ITER_RECORD].s = left;

	iter_set_info(iter);

	return false;
}